

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O2

void __thiscall duckdb::ArrowScanLocalState::~ArrowScanLocalState(ArrowScanLocalState *this)

{
  ~ArrowScanLocalState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ArrowScanLocalState(unique_ptr<ArrowArrayWrapper> current_chunk, ClientContext &context)
	    : chunk(current_chunk.release()), context(context) {
	}